

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaCom.c
# Opt level: O0

void Cba_Init(Abc_Frame_t *pAbc)

{
  Abc_Frame_t *pAbc_local;
  
  Cmd_CommandAdd(pAbc,"New word level",":read",Cba_CommandRead,0);
  Cmd_CommandAdd(pAbc,"New word level",":write",Cba_CommandWrite,0);
  Cmd_CommandAdd(pAbc,"New word level",":ps",Cba_CommandPs,0);
  Cmd_CommandAdd(pAbc,"New word level",":put",Cba_CommandPut,0);
  Cmd_CommandAdd(pAbc,"New word level",":get",Cba_CommandGet,0);
  Cmd_CommandAdd(pAbc,"New word level",":clp",Cba_CommandClp,0);
  Cmd_CommandAdd(pAbc,"New word level",":blast",Cba_CommandBlast,0);
  Cmd_CommandAdd(pAbc,"New word level",":cec",Cba_CommandCec,0);
  Cmd_CommandAdd(pAbc,"New word level",":test",Cba_CommandTest,0);
  return;
}

Assistant:

void Cba_Init( Abc_Frame_t * pAbc )
{
    Cmd_CommandAdd( pAbc, "New word level", ":read",       Cba_CommandRead,      0 );
    Cmd_CommandAdd( pAbc, "New word level", ":write",      Cba_CommandWrite,     0 );
    Cmd_CommandAdd( pAbc, "New word level", ":ps",         Cba_CommandPs,        0 );
    Cmd_CommandAdd( pAbc, "New word level", ":put",        Cba_CommandPut,       0 );
    Cmd_CommandAdd( pAbc, "New word level", ":get",        Cba_CommandGet,       0 );
    Cmd_CommandAdd( pAbc, "New word level", ":clp",        Cba_CommandClp,       0 );
    Cmd_CommandAdd( pAbc, "New word level", ":blast",      Cba_CommandBlast,     0 );
    Cmd_CommandAdd( pAbc, "New word level", ":cec",        Cba_CommandCec,       0 );
    Cmd_CommandAdd( pAbc, "New word level", ":test",       Cba_CommandTest,      0 );
}